

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_cast_data.hpp
# Opt level: O1

void __thiscall
duckdb::StructBoundCastData::StructBoundCastData
          (StructBoundCastData *this,vector<duckdb::BoundCastInfo,_true> *child_casts,
          LogicalType *target_p)

{
  iterator iVar1;
  pointer pBVar2;
  unsigned_long local_40;
  vector<duckdb::BoundCastInfo,_true> *local_38;
  
  (this->super_BoundCastData)._vptr_BoundCastData = (_func_int **)&PTR__StructBoundCastData_02487290
  ;
  pBVar2 = (child_casts->super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>
           ).super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  (this->child_cast_info).
  super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
  super__Vector_impl_data._M_start =
       (child_casts->super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>).
       super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->child_cast_info).
  super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar2;
  (this->child_cast_info).
  super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
  super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (child_casts->super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>).
       super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (child_casts->super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>).
  super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (child_casts->super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>).
  super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (child_casts->super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>).
  super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  LogicalType::LogicalType(&this->target,target_p);
  (this->target_null_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->target_null_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->target_null_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->target_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->target_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->source_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->target_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->source_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->source_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_40 = 0;
  if ((this->child_cast_info).
      super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
      super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->child_cast_info).
      super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>.
      super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = &this->child_cast_info;
    do {
      iVar1._M_current =
           (this->source_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->source_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->source_indexes,
                   iVar1,&local_40);
      }
      else {
        *iVar1._M_current = local_40;
        (this->source_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar1._M_current =
           (this->target_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->target_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->target_indexes,
                   iVar1,&local_40);
      }
      else {
        *iVar1._M_current = local_40;
        (this->target_indexes).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      local_40 = local_40 + 1;
    } while (local_40 <
             (ulong)(((long)(this->child_cast_info).
                            super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>
                            .
                            super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->child_cast_info).
                            super_vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>
                            .
                            super__Vector_base<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  return;
}

Assistant:

StructBoundCastData(vector<BoundCastInfo> child_casts, LogicalType target_p)
	    : child_cast_info(std::move(child_casts)), target(std::move(target_p)) {
		for (idx_t i = 0; i < child_cast_info.size(); i++) {
			source_indexes.push_back(i);
			target_indexes.push_back(i);
		}
	}